

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O2

void * get_proc(char *namez)

{
  void *pvVar1;
  
  if (libGL == (void *)0x0) {
    pvVar1 = (void *)0x0;
  }
  else if ((gladGetProcAddressPtr == (PFNGLXGETPROCADDRESSPROC_PRIVATE)0x0) ||
          (pvVar1 = (*gladGetProcAddressPtr)(namez), pvVar1 == (void *)0x0)) {
    pvVar1 = (void *)dlsym(libGL,namez);
    return pvVar1;
  }
  return pvVar1;
}

Assistant:

static
void* get_proc(const char *namez) {
    void* result = NULL;
    if(libGL == NULL) return NULL;

#if !defined(__APPLE__) && !defined(__HAIKU__)
    if(gladGetProcAddressPtr != NULL) {
        result = gladGetProcAddressPtr(namez);
    }
#endif
    if(result == NULL) {
#if defined(_WIN32) || defined(__CYGWIN__)
        result = (void*)GetProcAddress((HMODULE) libGL, namez);
#else
        result = dlsym(libGL, namez);
#endif
    }

    return result;
}